

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_param.c
# Opt level: O0

int getEvent(void *ptr,mpt_event *ev)

{
  mpt_message *pmVar1;
  int iVar2;
  undefined1 auStack_50 [4];
  int ret;
  mpt_message tmp;
  mpt_config *cfg;
  mpt_metatype *conf;
  mpt_event *ev_local;
  void *ptr_local;
  
  if (ev == (mpt_event *)0x0) {
    if (ptr != (void *)0x0) {
      (**(code **)(*ptr + 8))(ptr);
    }
    ptr_local._4_4_ = 0;
  }
  else if (ev->msg == (mpt_message *)0x0) {
    mpt_context_reply(ev->reply,-0x10,"%s","no default config query");
    ev->id = 0;
    ptr_local._4_4_ = 3;
  }
  else {
    pmVar1 = ev->msg;
    _auStack_50 = pmVar1->used;
    tmp.used = (size_t)pmVar1->base;
    tmp.base = pmVar1->cont;
    tmp.cont = (iovec *)pmVar1->clen;
    ptr_local._4_4_ = getArg((mpt_message *)auStack_50,5,"mpt_dispatch_param.get");
    if (-1 < ptr_local._4_4_) {
      tmp.clen = 0;
      if ((ptr == (void *)0x0) ||
         ((iVar2 = (*(code *)**ptr)(ptr,0x85,&tmp.clen), -1 < iVar2 && (tmp.clen != 0)))) {
        if (ev->reply == (mpt_reply_context *)0x0) {
          mpt_context_reply((mpt_reply_context *)0x0,1,"no event reply context");
          ptr_local._4_4_ = 0;
        }
        else {
          iVar2 = mpt_config_reply(ev->reply,(mpt_config *)tmp.clen,ptr_local._4_4_,
                                   (mpt_message *)auStack_50);
          if (iVar2 < 0) {
            mpt_context_reply(ev->reply,iVar2,"%s","failed to get config elements");
            ev->id = 0;
            ptr_local._4_4_ = 3;
          }
          else {
            ptr_local._4_4_ = 0;
          }
        }
      }
      else {
        mpt_context_reply(ev->reply,-2,"%s","bad config");
        ev->id = 0;
        ptr_local._4_4_ = 3;
      }
    }
  }
  return ptr_local._4_4_;
}

Assistant:

static int getEvent(void *ptr, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt_dispatch_param.get";
	MPT_INTERFACE(metatype) *conf = ptr;
	MPT_INTERFACE(config) *cfg;
	MPT_STRUCT(message) tmp;
	
	int ret;
	
	if (!ev) {
		if (conf) {
			conf->_vptr->unref(conf);
		}
		return 0;
	}
	if (!ev->msg) {
		return MPT_event_fail(ev, MPT_ERROR(MissingData), MPT_tr("no default config query"));
	}
	tmp = *ev->msg;
	if ((ret = getArg(&tmp, MPT_MESGTYPE(ParamGet), _func)) < 0) {
		return ret;
	}
	cfg = 0;
	if (conf) {
		if (MPT_metatype_convert(conf, MPT_ENUM(TypeConfigPtr), &cfg) < 0
		    || !cfg) {
			return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("bad config"));
		}
	}
	if (!ev->reply) {
		mpt_context_reply(0, 1, MPT_tr("no event reply context"));
		return MPT_EVENTFLAG(None);
	}
	ret = mpt_config_reply(ev->reply, cfg, ret, &tmp);
	if (ret < 0) {
		return MPT_event_fail(ev, ret, MPT_tr("failed to get config elements"));
	}
	return MPT_EVENTFLAG(None);
}